

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

ArrayWithPreallocation<unsigned_long,_4UL> * __thiscall
soul::ArrayWithPreallocation<unsigned_long,_4UL>::operator=
          (ArrayWithPreallocation<unsigned_long,_4UL> *this,
          ArrayWithPreallocation<unsigned_long,_4UL> *other)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  size_t i_1;
  ulong uVar3;
  size_t i_2;
  ulong uVar4;
  
  uVar4 = other->numActive;
  if (this->numActive < uVar4) {
    reserve(this,uVar4);
    puVar1 = other->items;
    puVar2 = this->items;
    for (uVar4 = 0; uVar3 = this->numActive, uVar4 < uVar3; uVar4 = uVar4 + 1) {
      puVar2[uVar4] = puVar1[uVar4];
    }
    puVar1 = this->items;
    puVar2 = other->items;
    for (; uVar3 < other->numActive; uVar3 = uVar3 + 1) {
      puVar1[uVar3] = puVar2[uVar3];
    }
    this->numActive = other->numActive;
  }
  else {
    shrink(this,uVar4);
    puVar1 = other->items;
    puVar2 = this->items;
    for (uVar4 = 0; uVar4 < this->numActive; uVar4 = uVar4 + 1) {
      puVar2[uVar4] = puVar1[uVar4];
    }
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (const ArrayWithPreallocation& other)
    {
        if (other.size() > numActive)
        {
            reserve (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];

            for (size_t i = numActive; i < other.size(); ++i)
                new (items + i) Item (other.items[i]);

            numActive = other.size();
        }
        else
        {
            shrink (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];
        }

        return *this;
    }